

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask18_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x12 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 0xe;
  *puVar1 = in[2] << 4 | *puVar1;
  *puVar1 = in[3] << 0x16 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[3] >> 10;
  *puVar1 = in[4] << 8 | *puVar1;
  *puVar1 = in[5] << 0x1a | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[5] >> 6;
  *puVar1 = in[6] << 0xc | *puVar1;
  *puVar1 = in[7] << 0x1e | *puVar1;
  out[4] = in[7] >> 2;
  return out + 5;
}

Assistant:

uint32_t *__fastpackwithoutmask18_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (18 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (18 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (18 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (18 - 16);
  ++in;

  return out + 1;
}